

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  size_type *psVar6;
  SlbCreateLoadBalancerHTTPListenerRequestType *proxy_host;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  HttpTestListener *pHVar7;
  undefined8 extraout_RAX;
  allocator<char> local_3b9;
  string local_3b8;
  string local_398 [32];
  string local_378 [32];
  undefined1 local_358 [32];
  SlbCreateLoadBalancerHTTPListenerResponseType resp_2;
  SlbAddBackendServersResponseType resp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  SlbAddBackendServersRequestType req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  paVar1 = &req.load_balancer_id.field_2;
  req.load_balancer_id._M_string_length = 0;
  req.load_balancer_id.field_2._M_allocated_capacity =
       req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar2 = &req.backend_servers.field_2;
  req.backend_servers._M_string_length = 0;
  req.backend_servers.field_2._M_allocated_capacity =
       req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar3 = &req.host_id.field_2;
  req.host_id._M_string_length = 0;
  req.host_id.field_2._M_allocated_capacity =
       req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  paVar4 = &req.owner_account.field_2;
  req.owner_account._M_string_length = 0;
  req.owner_account.field_2._M_allocated_capacity =
       req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
  resp.load_balancer_id._M_dataplus._M_p = (pointer)&resp.load_balancer_id.field_2;
  resp.backend_servers.
  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resp.backend_servers.
  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resp.backend_servers.
  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resp.load_balancer_id._M_string_length = 0;
  resp.load_balancer_id.field_2._M_allocated_capacity =
       resp.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
  req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
  req.host_id._M_dataplus._M_p = (pointer)paVar3;
  req.owner_account._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"my_appid",(allocator<char> *)&resp_2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_358,"my_secret",&local_3b9);
  proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
               aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
    aliyun::SlbAddBackendServersResponseType::~SlbAddBackendServersResponseType(&resp);
    aliyun::SlbAddBackendServersRequestType::~SlbAddBackendServersRequestType(&req);
    req.load_balancer_id._M_string_length = 0;
    req.load_balancer_id.field_2._M_allocated_capacity =
         req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    req.backend_servers._M_string_length = 0;
    req.backend_servers.field_2._M_allocated_capacity =
         req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
    req.host_id._M_string_length = 0;
    req.host_id.field_2._M_allocated_capacity =
         req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    req.owner_account._M_string_length = 0;
    req.owner_account.field_2._M_allocated_capacity =
         req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)local_208;
    local_218._8_8_ = (undefined1 *)0x0;
    local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    resp.backend_servers.
    super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&resp.backend_servers.
                   super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    resp.backend_servers.
    super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resp.backend_servers.
    super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)resp.backend_servers.
                          super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    resp.load_balancer_id._M_string_length = (long)&resp.load_balancer_id.field_2 + 8;
    resp.load_balancer_id.field_2._M_allocated_capacity = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    resp.load_balancer_id.field_2._M_local_buf[8] = '\0';
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
    req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
    req.host_id._M_dataplus._M_p = (pointer)paVar3;
    req.owner_account._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_398,"my_appid",(allocator<char> *)&resp_2);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_358,"my_secret",&local_3b9);
    proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                 aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_378);
    if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
      aliyun::SlbCreateLoadBalancerResponseType::~SlbCreateLoadBalancerResponseType
                ((SlbCreateLoadBalancerResponseType *)&resp);
      aliyun::SlbCreateLoadBalancerRequestType::~SlbCreateLoadBalancerRequestType
                ((SlbCreateLoadBalancerRequestType *)&req);
      req.load_balancer_id._M_string_length = 0;
      req.load_balancer_id.field_2._M_allocated_capacity =
           req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req.backend_servers._M_string_length = 0;
      req.backend_servers.field_2._M_allocated_capacity =
           req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req.host_id._M_string_length = 0;
      req.host_id.field_2._M_allocated_capacity =
           req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req.owner_account._M_string_length = 0;
      req.owner_account.field_2._M_allocated_capacity =
           req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_218._M_allocated_capacity = (size_type)local_208;
      local_218._8_8_ = (undefined1 *)0x0;
      local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
      local_1f8._M_allocated_capacity = (size_type)&local_1e8;
      local_1f8._8_8_ = 0;
      local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
      local_1d8._M_allocated_capacity = (size_type)&local_1c8;
      local_1d8._8_8_ = 0;
      local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
      local_1b8._M_allocated_capacity = (size_type)&local_1a8;
      local_1b8._8_8_ = 0;
      local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
      local_198._M_allocated_capacity = (size_type)&local_188;
      local_198._8_8_ = 0;
      local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
      local_178._M_allocated_capacity = (size_type)&local_168;
      local_178._8_8_ = 0;
      local_168._M_local_buf[0] = '\0';
      local_158._M_p = (pointer)&local_148;
      local_150 = 0;
      local_148._M_local_buf[0] = '\0';
      local_138._M_p = (pointer)&local_128;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_118._M_p = (pointer)&local_108;
      local_110 = 0;
      local_108._M_local_buf[0] = '\0';
      local_f8._M_p = (pointer)&local_e8;
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      local_d8._M_p = (pointer)&local_c8;
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      local_b8._M_p = (pointer)&local_a8;
      local_b0 = 0;
      local_a8._M_local_buf[0] = '\0';
      local_98._M_p = (pointer)&local_88;
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_58._M_p = (pointer)&local_48;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
      req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
      req.host_id._M_dataplus._M_p = (pointer)paVar3;
      req.owner_account._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
      std::__cxx11::string::string<std::allocator<char>>
                (local_378,"my_appid",(allocator<char> *)&local_3b8);
      std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
      proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                   aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string((string *)&resp);
      if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
        aliyun::SlbCreateLoadBalancerHTTPListenerRequestType::
        ~SlbCreateLoadBalancerHTTPListenerRequestType
                  ((SlbCreateLoadBalancerHTTPListenerRequestType *)&req);
        req.load_balancer_id._M_string_length = 0;
        req.load_balancer_id.field_2._M_allocated_capacity =
             req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.backend_servers._M_string_length = 0;
        req.backend_servers.field_2._M_allocated_capacity =
             req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.host_id._M_string_length = 0;
        req.host_id.field_2._M_allocated_capacity =
             req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.owner_account._M_string_length = 0;
        req.owner_account.field_2._M_allocated_capacity =
             req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_218._M_allocated_capacity = (size_type)local_208;
        local_218._8_8_ = (undefined1 *)0x0;
        local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
        local_1f8._M_allocated_capacity = (size_type)&local_1e8;
        local_1f8._8_8_ = 0;
        local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
        local_1d8._M_allocated_capacity = (size_type)&local_1c8;
        local_1d8._8_8_ = 0;
        local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
        local_1b8._M_allocated_capacity = (size_type)&local_1a8;
        local_1b8._8_8_ = 0;
        local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
        local_198._M_allocated_capacity = (size_type)&local_188;
        local_198._8_8_ = 0;
        local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
        local_178._M_allocated_capacity = (size_type)&local_168;
        local_178._8_8_ = 0;
        local_168._M_local_buf[0] = '\0';
        local_158._M_p = (pointer)&local_148;
        local_150 = 0;
        local_148._M_local_buf[0] = '\0';
        local_138._M_p = (pointer)&local_128;
        local_130 = 0;
        local_128._M_local_buf[0] = '\0';
        req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
        req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
        req.host_id._M_dataplus._M_p = (pointer)paVar3;
        req.owner_account._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_378,"my_appid",(allocator<char> *)&local_3b8);
        std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
        this = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::string::~string((string *)&resp);
        if (this == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
          aliyun::SlbCreateLoadBalancerTCPListenerRequestType::
          ~SlbCreateLoadBalancerTCPListenerRequestType
                    ((SlbCreateLoadBalancerTCPListenerRequestType *)&req);
          req.load_balancer_id._M_string_length = 0;
          req.load_balancer_id.field_2._M_allocated_capacity =
               req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.backend_servers._M_string_length = 0;
          req.backend_servers.field_2._M_allocated_capacity =
               req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.host_id._M_string_length = 0;
          req.host_id.field_2._M_allocated_capacity =
               req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.owner_account._M_string_length = 0;
          req.owner_account.field_2._M_allocated_capacity =
               req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_218._M_allocated_capacity = (size_type)local_208;
          local_218._8_8_ = (undefined1 *)0x0;
          local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
          req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
          req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
          req.host_id._M_dataplus._M_p = (pointer)paVar3;
          req.owner_account._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_378,"my_appid",(allocator<char> *)&local_3b8);
          std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
          proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                       aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
          this = &local_218;
          std::__cxx11::string::~string(local_398);
          std::__cxx11::string::~string(local_378);
          std::__cxx11::string::~string((string *)&resp);
          if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
            aliyun::SlbDeleteLoadBalancerRequestType::~SlbDeleteLoadBalancerRequestType
                      ((SlbDeleteLoadBalancerRequestType *)&req);
            req.load_balancer_id._M_string_length = 0;
            req.load_balancer_id.field_2._M_allocated_capacity =
                 req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.backend_servers._M_string_length = 0;
            req.backend_servers.field_2._M_allocated_capacity =
                 req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.host_id._M_string_length = 0;
            req.host_id.field_2._M_allocated_capacity =
                 req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.owner_account._M_string_length = 0;
            req.owner_account.field_2._M_allocated_capacity =
                 req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
            req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
            req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
            req.host_id._M_dataplus._M_p = (pointer)paVar3;
            req.owner_account._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_378,"my_appid",(allocator<char> *)&local_3b8);
            std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
            proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                         aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
            std::__cxx11::string::~string(local_398);
            std::__cxx11::string::~string(local_378);
            std::__cxx11::string::~string((string *)&resp);
            if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
              aliyun::SlbDeleteLoadBalancerListenerRequestType::
              ~SlbDeleteLoadBalancerListenerRequestType
                        ((SlbDeleteLoadBalancerListenerRequestType *)&req);
              req.load_balancer_id._M_string_length = 0;
              req.load_balancer_id.field_2._M_allocated_capacity =
                   req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req.backend_servers._M_string_length = 0;
              req.backend_servers.field_2._M_allocated_capacity =
                   req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req.host_id._M_string_length = 0;
              req.host_id.field_2._M_allocated_capacity =
                   req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
              req.owner_account._M_string_length = 0;
              req.owner_account.field_2._M_allocated_capacity =
                   req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
              _resp_2 = (pointer)0x0;
              req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
              req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
              req.host_id._M_dataplus._M_p = (pointer)paVar3;
              req.owner_account._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_378,"my_appid",(allocator<char> *)&local_3b8);
              std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_3b9);
              proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                           aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
              std::__cxx11::string::~string(local_398);
              std::__cxx11::string::~string(local_378);
              std::__cxx11::string::~string((string *)&resp);
              if (proxy_host != (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
                aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                std::__cxx11::string::~string((string *)local_358);
                if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                }
                pHVar7 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3b8,
                           "{  \"Listeners\": {    \"Listener\": [      {        \"BackendServers\": {          \"BackendServer\": [            {              \"ServerId\": \"ServerId\",              \"ServerHealthStatus\": \"ServerHealthStatus\"            }          ]        },        \"ListenerPort\": 0      }    ]  }}"
                           ,&local_3b9);
                HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                std::__cxx11::string::~string((string *)&local_3b8);
                HttpTestListener::Start(pHVar7);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.backend_servers);
                std::__cxx11::string::assign((char *)&req.host_id);
                std::__cxx11::string::assign((char *)&req.owner_account);
                aliyun::Slb::DescribeBackendServers
                          ((SlbDescribeBackendServersRequestType *)proxy_host,
                           (SlbDescribeBackendServersResponseType *)&req,(SlbErrorInfo *)&resp_2);
                HttpTestListener::WaitComplete(pHVar7);
LAB_001089b0:
                HttpTestListener::~HttpTestListener(pHVar7);
                goto LAB_0010947a;
              }
              std::
              vector<aliyun::SlbDescribeBackendServersListenerType,_std::allocator<aliyun::SlbDescribeBackendServersListenerType>_>
              ::~vector((vector<aliyun::SlbDescribeBackendServersListenerType,_std::allocator<aliyun::SlbDescribeBackendServersListenerType>_>
                         *)&resp_2);
              aliyun::SlbDescribeBackendServersRequestType::~SlbDescribeBackendServersRequestType
                        ((SlbDescribeBackendServersRequestType *)&req);
              resp.backend_servers.
              super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&resp.backend_servers.
                             super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              resp.backend_servers.
              super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              resp.backend_servers.
              super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)resp.backend_servers.
                                    super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              resp.load_balancer_id._M_string_length = (long)&resp.load_balancer_id.field_2 + 8;
              resp.load_balancer_id.field_2._M_allocated_capacity = 0;
              resp.load_balancer_id.field_2._M_local_buf[8] = '\0';
              local_2d8._M_allocated_capacity = (size_type)&local_2c8;
              local_2d8._8_8_ = 0;
              req.backend_servers._M_dataplus._M_p = (pointer)0x0;
              req.backend_servers._M_string_length = 0;
              req.load_balancer_id.field_2._M_allocated_capacity = 0;
              req.load_balancer_id.field_2._8_8_ = 0;
              req.load_balancer_id._M_dataplus._M_p = (pointer)0x0;
              req.load_balancer_id._M_string_length = 0;
              req.backend_servers.field_2._8_8_ = 0;
              req.host_id._M_dataplus._M_p = req.host_id._M_dataplus._M_p & 0xffffffffffffff00;
              req.host_id.field_2._8_8_ = 0;
              req.owner_account._M_dataplus._M_p =
                   req.owner_account._M_dataplus._M_p & 0xffffffffffffff00;
              req.owner_account.field_2._8_8_ = 0;
              local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_208._0_8_ = &local_1f8;
              local_208._8_8_ = 0;
              local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_1e8._M_allocated_capacity = (size_type)&local_1d8;
              local_1e8._8_8_ = 0;
              local_2c8._M_local_buf[0] = '\0';
              local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_1c8._8_8_ = 0;
              local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00
              ;
              req.backend_servers.field_2._M_allocated_capacity = (size_type)&req.host_id;
              req.host_id.field_2._M_allocated_capacity = (size_type)&req.owner_account;
              req.owner_account.field_2._M_allocated_capacity = (size_type)this;
              local_1c8._M_allocated_capacity = (size_type)&local_1b8;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_398,"my_appid",(allocator<char> *)&resp_2);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_358,"my_secret",&local_3b9);
              proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                           aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
              std::__cxx11::string::~string((string *)local_358);
              std::__cxx11::string::~string(local_398);
              std::__cxx11::string::~string(local_378);
              if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                aliyun::SlbDescribeLoadBalancerAttributeResponseType::
                ~SlbDescribeLoadBalancerAttributeResponseType
                          ((SlbDescribeLoadBalancerAttributeResponseType *)&req);
                aliyun::SlbDescribeLoadBalancerAttributeRequestType::
                ~SlbDescribeLoadBalancerAttributeRequestType
                          ((SlbDescribeLoadBalancerAttributeRequestType *)&resp);
                resp.backend_servers.
                super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)&resp.backend_servers.
                               super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                resp.backend_servers.
                super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                resp.backend_servers.
                super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)resp.backend_servers.
                                      super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                resp.load_balancer_id._M_string_length = (long)&resp.load_balancer_id.field_2 + 8;
                resp.load_balancer_id.field_2._M_allocated_capacity = 0;
                resp.load_balancer_id.field_2._M_local_buf[8] = '\0';
                local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                local_2d8._8_8_ = 0;
                local_2c8._M_local_buf[0] = '\0';
                local_2b8._8_8_ = 0;
                psVar5 = &req.load_balancer_id.field_2._M_allocated_capacity + 1;
                req.load_balancer_id.field_2._M_allocated_capacity = 0;
                req.load_balancer_id.field_2._8_8_ =
                     req.load_balancer_id.field_2._8_8_ & 0xffffffffffffff00;
                psVar6 = &req.backend_servers.field_2._M_allocated_capacity + 1;
                req.backend_servers.field_2._M_allocated_capacity = 0;
                req.backend_servers.field_2._8_8_ =
                     req.backend_servers.field_2._8_8_ & 0xffffffffffffff00;
                req.host_id._M_string_length = (long)&req.host_id.field_2 + 8;
                req.host_id.field_2._M_allocated_capacity = 0;
                req.host_id.field_2._8_8_ = req.host_id.field_2._8_8_ & 0xffffffffffffff00;
                req.owner_account._M_string_length = (long)&req.owner_account.field_2 + 8;
                req.owner_account.field_2._M_allocated_capacity = 0;
                req.owner_account.field_2._8_8_ =
                     req.owner_account.field_2._8_8_ & 0xffffffffffffff00;
                local_218._8_8_ = local_208 + 8;
                local_208._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
                local_1e8._M_allocated_capacity = (size_type)&local_1d8;
                local_1e8._8_8_ = 0;
                local_1d8._M_allocated_capacity =
                     local_1d8._M_allocated_capacity & 0xffffffffffffff00;
                local_1c8._8_8_ = 0;
                local_1b8._M_allocated_capacity =
                     local_1b8._M_allocated_capacity & 0xffffffffffffff00;
                local_1a8._M_allocated_capacity = (size_type)&local_198;
                local_1a8._8_8_ = 0;
                local_2a8._M_local_buf[0] = '\0';
                local_198._M_allocated_capacity =
                     local_198._M_allocated_capacity & 0xffffffffffffff00;
                local_188._M_allocated_capacity = (size_type)&local_178;
                local_188._8_8_ = 0;
                local_178._M_allocated_capacity =
                     local_178._M_allocated_capacity & 0xffffffffffffff00;
                local_2b8._M_allocated_capacity = (size_type)&local_2a8;
                req.load_balancer_id._M_string_length = (size_type)psVar5;
                req.backend_servers._M_string_length = (size_type)psVar6;
                local_1c8._M_allocated_capacity = (size_type)&local_1b8;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_398,"my_appid",(allocator<char> *)&resp_2);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_358,"my_secret",&local_3b9);
                proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                             aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
                std::__cxx11::string::~string((string *)local_358);
                std::__cxx11::string::~string(local_398);
                std::__cxx11::string::~string(local_378);
                if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                  aliyun::SlbDescribeLoadBalancerHTTPListenerAttributeResponseType::
                  ~SlbDescribeLoadBalancerHTTPListenerAttributeResponseType
                            ((SlbDescribeLoadBalancerHTTPListenerAttributeResponseType *)&req);
                  aliyun::SlbDescribeLoadBalancerHTTPListenerAttributeRequestType::
                  ~SlbDescribeLoadBalancerHTTPListenerAttributeRequestType
                            ((SlbDescribeLoadBalancerHTTPListenerAttributeRequestType *)&resp);
                  req.load_balancer_id._M_dataplus._M_p = (pointer)&req.load_balancer_id.field_2;
                  req.load_balancer_id._M_string_length = 0;
                  req.load_balancer_id.field_2._M_allocated_capacity =
                       req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.backend_servers._M_string_length = 0;
                  req.backend_servers.field_2._M_allocated_capacity =
                       req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.host_id._M_dataplus._M_p = (pointer)&req.host_id.field_2;
                  req.host_id._M_string_length = 0;
                  req.host_id.field_2._M_allocated_capacity =
                       req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
                  req.owner_account._M_string_length = 0;
                  req.owner_account.field_2._M_allocated_capacity =
                       req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  _resp_2 = (pointer)0x0;
                  req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_378,"my_appid",(allocator<char> *)&local_3b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_398,"my_secret",&local_3b9);
                  proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                               aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                  std::__cxx11::string::~string(local_398);
                  std::__cxx11::string::~string(local_378);
                  std::__cxx11::string::~string((string *)&resp);
                  if (proxy_host != (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
                    aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                    std::__cxx11::string::~string((string *)local_358);
                    if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                    }
                    pHVar7 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3b8,
                               "{  \"LoadBalancers\": {    \"LoadBalancer\": [      {        \"LoadBalancerId\": \"LoadBalancerId\",        \"LoadBalancerName\": \"LoadBalancerName\",        \"LoadBalancerStatus\": \"LoadBalancerStatus\"      }    ]  }}"
                               ,&local_3b9);
                    HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                    std::__cxx11::string::~string((string *)&local_3b8);
                    HttpTestListener::Start(pHVar7);
                    std::__cxx11::string::assign((char *)&req);
                    std::__cxx11::string::assign((char *)&req.backend_servers);
                    std::__cxx11::string::assign((char *)&req.host_id);
                    std::__cxx11::string::assign((char *)&req.owner_account);
                    aliyun::Slb::DescribeLoadBalancers
                              ((SlbDescribeLoadBalancersRequestType *)proxy_host,
                               (SlbDescribeLoadBalancersResponseType *)&req,(SlbErrorInfo *)&resp_2)
                    ;
                    HttpTestListener::WaitComplete(pHVar7);
                    goto LAB_001089b0;
                  }
                  std::
                  vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
                  ::~vector((vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
                             *)&resp_2);
                  aliyun::SlbDescribeLoadBalancersRequestType::~SlbDescribeLoadBalancersRequestType
                            ((SlbDescribeLoadBalancersRequestType *)&req);
                  resp.backend_servers.
                  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)&resp.backend_servers.
                                 super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  resp.backend_servers.
                  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  resp.backend_servers.
                  super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)resp.backend_servers.
                                        super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  resp.load_balancer_id._M_string_length = (long)&resp.load_balancer_id.field_2 + 8;
                  resp.load_balancer_id.field_2._M_allocated_capacity = 0;
                  resp.load_balancer_id.field_2._M_local_buf[8] = '\0';
                  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
                  local_2d8._8_8_ = 0;
                  local_2c8._M_local_buf[0] = '\0';
                  local_2b8._8_8_ = 0;
                  req.load_balancer_id.field_2._M_allocated_capacity = 0;
                  req.load_balancer_id.field_2._8_8_ =
                       req.load_balancer_id.field_2._8_8_ & 0xffffffffffffff00;
                  req.backend_servers.field_2._M_allocated_capacity = 0;
                  local_2a8._M_local_buf[0] = '\0';
                  req.backend_servers.field_2._8_8_ =
                       req.backend_servers.field_2._8_8_ & 0xffffffffffffff00;
                  req.host_id.field_2._8_8_ = 0;
                  req.owner_account._M_dataplus._M_p =
                       req.owner_account._M_dataplus._M_p & 0xffffffffffffff00;
                  local_2b8._M_allocated_capacity = (size_type)&local_2a8;
                  req.load_balancer_id._M_string_length = (size_type)psVar5;
                  req.backend_servers._M_string_length = (size_type)psVar6;
                  req.host_id.field_2._M_allocated_capacity = (size_type)&req.owner_account;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_398,"my_appid",(allocator<char> *)&resp_2);
                  paVar1 = &req.load_balancer_id.field_2;
                  paVar3 = &req.host_id.field_2;
                  paVar4 = &req.owner_account.field_2;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_358,"my_secret",&local_3b9);
                  proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                               aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
                  std::__cxx11::string::~string((string *)local_358);
                  std::__cxx11::string::~string(local_398);
                  std::__cxx11::string::~string(local_378);
                  if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                    aliyun::SlbDescribeLoadBalancerTCPListenerAttributeResponseType::
                    ~SlbDescribeLoadBalancerTCPListenerAttributeResponseType
                              ((SlbDescribeLoadBalancerTCPListenerAttributeResponseType *)&req);
                    aliyun::SlbDescribeLoadBalancerTCPListenerAttributeRequestType::
                    ~SlbDescribeLoadBalancerTCPListenerAttributeRequestType
                              ((SlbDescribeLoadBalancerTCPListenerAttributeRequestType *)&resp);
                    req.load_balancer_id._M_string_length = 0;
                    req.load_balancer_id.field_2._M_allocated_capacity =
                         req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    req.backend_servers._M_string_length = 0;
                    req.backend_servers.field_2._M_allocated_capacity =
                         req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    _resp_2 = (pointer)0x0;
                    req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                    req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_378,"my_appid",(allocator<char> *)&local_3b8);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_398,"my_secret",&local_3b9);
                    proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                 aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                    std::__cxx11::string::~string(local_398);
                    std::__cxx11::string::~string(local_378);
                    std::__cxx11::string::~string((string *)&resp);
                    if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                      std::
                      vector<aliyun::SlbDescribeRegionsRegionType,_std::allocator<aliyun::SlbDescribeRegionsRegionType>_>
                      ::~vector((vector<aliyun::SlbDescribeRegionsRegionType,_std::allocator<aliyun::SlbDescribeRegionsRegionType>_>
                                 *)&resp_2);
                      aliyun::SlbDescribeRegionsRequestType::~SlbDescribeRegionsRequestType
                                ((SlbDescribeRegionsRequestType *)&req);
                      req.load_balancer_id._M_string_length = 0;
                      req.load_balancer_id.field_2._M_allocated_capacity =
                           req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.backend_servers._M_string_length = 0;
                      req.backend_servers.field_2._M_allocated_capacity =
                           req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.host_id._M_string_length = 0;
                      req.host_id.field_2._M_allocated_capacity =
                           req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.owner_account._M_string_length = 0;
                      req.owner_account.field_2._M_allocated_capacity =
                           req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      resp.backend_servers.
                      super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      resp.backend_servers.
                      super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      resp.backend_servers.
                      super__Vector_base<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      resp.load_balancer_id._M_dataplus._M_p =
                           (pointer)&resp.load_balancer_id.field_2;
                      resp.load_balancer_id._M_string_length = 0;
                      resp.load_balancer_id.field_2._M_allocated_capacity =
                           resp.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                      req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                      req.host_id._M_dataplus._M_p = (pointer)paVar3;
                      req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_378,"cn-hangzhou",(allocator<char> *)&local_3b8);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_398,"my_appid",(allocator<char> *)&resp_2);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_358,"my_secret",&local_3b9);
                      proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                   aliyun::Slb::CreateSlbClient(local_378,local_398,local_358);
                      std::__cxx11::string::~string((string *)local_358);
                      std::__cxx11::string::~string(local_398);
                      std::__cxx11::string::~string(local_378);
                      if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                        aliyun::SlbRemoveBackendServersResponseType::
                        ~SlbRemoveBackendServersResponseType
                                  ((SlbRemoveBackendServersResponseType *)&resp);
                        aliyun::SlbRemoveBackendServersRequestType::
                        ~SlbRemoveBackendServersRequestType
                                  ((SlbRemoveBackendServersRequestType *)&req);
                        req.load_balancer_id._M_string_length = 0;
                        req.load_balancer_id.field_2._M_allocated_capacity =
                             req.load_balancer_id.field_2._M_allocated_capacity & 0xffffffffffffff00
                        ;
                        req.backend_servers._M_string_length = 0;
                        req.backend_servers.field_2._M_allocated_capacity =
                             req.backend_servers.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req.host_id._M_string_length = 0;
                        req.host_id.field_2._M_allocated_capacity =
                             req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        req.owner_account._M_string_length = 0;
                        req.owner_account.field_2._M_allocated_capacity =
                             req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        local_218._M_allocated_capacity = (size_type)local_208;
                        local_218._8_8_ = (undefined1 *)0x0;
                        local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
                        local_1f8._M_allocated_capacity = (size_type)&local_1e8;
                        local_1f8._8_8_ = 0;
                        local_1e8._M_allocated_capacity =
                             local_1e8._M_allocated_capacity & 0xffffffffffffff00;
                        local_1d8._M_allocated_capacity = (size_type)&local_1c8;
                        local_1d8._8_8_ = 0;
                        local_1c8._M_allocated_capacity =
                             local_1c8._M_allocated_capacity & 0xffffffffffffff00;
                        local_1b8._M_allocated_capacity = (size_type)&local_1a8;
                        local_1b8._8_8_ = 0;
                        local_1a8._M_allocated_capacity =
                             local_1a8._M_allocated_capacity & 0xffffffffffffff00;
                        local_198._M_allocated_capacity = (size_type)&local_188;
                        local_198._8_8_ = 0;
                        local_188._M_allocated_capacity =
                             local_188._M_allocated_capacity & 0xffffffffffffff00;
                        local_178._M_allocated_capacity = (size_type)&local_168;
                        local_178._8_8_ = 0;
                        local_168._M_local_buf[0] = '\0';
                        local_158._M_p = (pointer)&local_148;
                        local_150 = 0;
                        local_148._M_local_buf[0] = '\0';
                        local_138._M_p = (pointer)&local_128;
                        local_130 = 0;
                        local_128._M_local_buf[0] = '\0';
                        local_118._M_p = (pointer)&local_108;
                        local_110 = 0;
                        local_108._M_local_buf[0] = '\0';
                        local_f8._M_p = (pointer)&local_e8;
                        local_f0 = 0;
                        local_e8._M_local_buf[0] = '\0';
                        local_d8._M_p = (pointer)&local_c8;
                        local_d0 = 0;
                        local_c8._M_local_buf[0] = '\0';
                        local_b8._M_p = (pointer)&local_a8;
                        local_b0 = 0;
                        local_a8._M_local_buf[0] = '\0';
                        local_98._M_p = (pointer)&local_88;
                        local_90 = 0;
                        local_88._M_local_buf[0] = '\0';
                        req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                        req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                        req.host_id._M_dataplus._M_p = (pointer)paVar3;
                        req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_378,"my_appid",(allocator<char> *)&local_3b8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_398,"my_secret",&local_3b9);
                        proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                     aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                        std::__cxx11::string::~string(local_398);
                        std::__cxx11::string::~string(local_378);
                        std::__cxx11::string::~string((string *)&resp);
                        if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                          aliyun::SlbSetLoadBalancerHTTPListenerAttributeRequestType::
                          ~SlbSetLoadBalancerHTTPListenerAttributeRequestType
                                    ((SlbSetLoadBalancerHTTPListenerAttributeRequestType *)&req);
                          req.load_balancer_id._M_string_length = 0;
                          req.load_balancer_id.field_2._M_allocated_capacity =
                               req.load_balancer_id.field_2._M_allocated_capacity &
                               0xffffffffffffff00;
                          req.backend_servers._M_string_length = 0;
                          req.backend_servers.field_2._M_allocated_capacity =
                               req.backend_servers.field_2._M_allocated_capacity &
                               0xffffffffffffff00;
                          req.host_id._M_string_length = 0;
                          req.host_id.field_2._M_allocated_capacity =
                               req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          req.owner_account._M_string_length = 0;
                          req.owner_account.field_2._M_allocated_capacity =
                               req.owner_account.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          local_218._M_allocated_capacity = (size_type)local_208;
                          local_218._8_8_ = (undefined1 *)0x0;
                          local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
                          req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                          req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                          req.host_id._M_dataplus._M_p = (pointer)paVar3;
                          req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_378,"my_appid",(allocator<char> *)&local_3b8);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_398,"my_secret",&local_3b9);
                          proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                       aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                          std::__cxx11::string::~string(local_398);
                          std::__cxx11::string::~string(local_378);
                          std::__cxx11::string::~string((string *)&resp);
                          if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                            aliyun::SlbSetLoadBalancerListenerStatusRequestType::
                            ~SlbSetLoadBalancerListenerStatusRequestType
                                      ((SlbSetLoadBalancerListenerStatusRequestType *)&req);
                            req.load_balancer_id._M_string_length = 0;
                            req.load_balancer_id.field_2._M_allocated_capacity =
                                 req.load_balancer_id.field_2._M_allocated_capacity &
                                 0xffffffffffffff00;
                            req.backend_servers._M_string_length = 0;
                            req.backend_servers.field_2._M_allocated_capacity =
                                 req.backend_servers.field_2._M_allocated_capacity &
                                 0xffffffffffffff00;
                            req.host_id._M_string_length = 0;
                            req.host_id.field_2._M_allocated_capacity =
                                 req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            req.owner_account._M_string_length = 0;
                            req.owner_account.field_2._M_allocated_capacity =
                                 req.owner_account.field_2._M_allocated_capacity &
                                 0xffffffffffffff00;
                            req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                            req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                            req.host_id._M_dataplus._M_p = (pointer)paVar3;
                            req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_378,"my_appid",(allocator<char> *)&local_3b8);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_398,"my_secret",&local_3b9);
                            proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                         aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                            std::__cxx11::string::~string(local_398);
                            std::__cxx11::string::~string(local_378);
                            std::__cxx11::string::~string((string *)&resp);
                            if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                              aliyun::SlbSetLoadBalancerNameRequestType::
                              ~SlbSetLoadBalancerNameRequestType
                                        ((SlbSetLoadBalancerNameRequestType *)&req);
                              req.load_balancer_id._M_string_length = 0;
                              req.load_balancer_id.field_2._M_allocated_capacity =
                                   req.load_balancer_id.field_2._M_allocated_capacity &
                                   0xffffffffffffff00;
                              req.backend_servers._M_string_length = 0;
                              req.backend_servers.field_2._M_allocated_capacity =
                                   req.backend_servers.field_2._M_allocated_capacity &
                                   0xffffffffffffff00;
                              req.host_id._M_string_length = 0;
                              req.host_id.field_2._M_allocated_capacity =
                                   req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                              req.owner_account._M_string_length = 0;
                              req.owner_account.field_2._M_allocated_capacity =
                                   req.owner_account.field_2._M_allocated_capacity &
                                   0xffffffffffffff00;
                              req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                              req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                              req.host_id._M_dataplus._M_p = (pointer)paVar3;
                              req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp,"cn-hangzhou",(allocator<char> *)local_358)
                              ;
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_378,"my_appid",(allocator<char> *)&local_3b8);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_398,"my_secret",&local_3b9);
                              proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                           aliyun::Slb::CreateSlbClient(&resp,local_378,local_398);
                              std::__cxx11::string::~string(local_398);
                              std::__cxx11::string::~string(local_378);
                              std::__cxx11::string::~string((string *)&resp);
                              if (proxy_host == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0)
                              {
                                aliyun::SlbSetLoadBalancerStatusRequestType::
                                ~SlbSetLoadBalancerStatusRequestType
                                          ((SlbSetLoadBalancerStatusRequestType *)&req);
                                req.load_balancer_id._M_string_length = 0;
                                req.load_balancer_id.field_2._M_allocated_capacity =
                                     req.load_balancer_id.field_2._M_allocated_capacity &
                                     0xffffffffffffff00;
                                req.backend_servers._M_string_length = 0;
                                req.backend_servers.field_2._M_allocated_capacity =
                                     req.backend_servers.field_2._M_allocated_capacity &
                                     0xffffffffffffff00;
                                req.host_id._M_string_length = 0;
                                req.host_id.field_2._M_allocated_capacity =
                                     req.host_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                                req.owner_account._M_string_length = 0;
                                req.owner_account.field_2._M_allocated_capacity =
                                     req.owner_account.field_2._M_allocated_capacity &
                                     0xffffffffffffff00;
                                local_218._M_allocated_capacity = (size_type)local_208;
                                local_218._8_8_ = (undefined1 *)0x0;
                                local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
                                local_1f8._M_allocated_capacity = (size_type)&local_1e8;
                                local_1f8._8_8_ = 0;
                                local_1e8._M_allocated_capacity =
                                     local_1e8._M_allocated_capacity & 0xffffffffffffff00;
                                local_1d8._M_allocated_capacity = (size_type)&local_1c8;
                                local_1d8._8_8_ = 0;
                                local_1c8._M_allocated_capacity =
                                     local_1c8._M_allocated_capacity & 0xffffffffffffff00;
                                local_1b8._M_allocated_capacity = (size_type)&local_1a8;
                                local_1b8._8_8_ = 0;
                                local_1a8._M_allocated_capacity =
                                     local_1a8._M_allocated_capacity & 0xffffffffffffff00;
                                local_198._M_allocated_capacity = (size_type)&local_188;
                                local_198._8_8_ = 0;
                                local_188._M_allocated_capacity =
                                     local_188._M_allocated_capacity & 0xffffffffffffff00;
                                local_178._M_allocated_capacity = (size_type)&local_168;
                                local_178._8_8_ = 0;
                                local_168._M_local_buf[0] = '\0';
                                local_158._M_p = (pointer)&local_148;
                                local_150 = 0;
                                local_148._M_local_buf[0] = '\0';
                                local_138._M_p = (pointer)&local_128;
                                local_130 = 0;
                                local_128._M_local_buf[0] = '\0';
                                req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                                req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                                req.host_id._M_dataplus._M_p = (pointer)paVar3;
                                req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&resp,"cn-hangzhou",
                                           (allocator<char> *)local_358);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_378,"my_appid",(allocator<char> *)&local_3b8);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_398,"my_secret",&local_3b9);
                                proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                             aliyun::Slb::CreateSlbClient(&resp,local_378,local_398)
                                ;
                                std::__cxx11::string::~string(local_398);
                                std::__cxx11::string::~string(local_378);
                                std::__cxx11::string::~string((string *)&resp);
                                if (proxy_host ==
                                    (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                                  aliyun::SlbSetLoadBalancerTCPListenerAttributeRequestType::
                                  ~SlbSetLoadBalancerTCPListenerAttributeRequestType
                                            ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)
                                             &req);
                                  req.load_balancer_id._M_string_length = 0;
                                  req.load_balancer_id.field_2._M_allocated_capacity =
                                       req.load_balancer_id.field_2._M_allocated_capacity &
                                       0xffffffffffffff00;
                                  req.backend_servers._M_string_length = 0;
                                  req.backend_servers.field_2._M_allocated_capacity =
                                       req.backend_servers.field_2._M_allocated_capacity &
                                       0xffffffffffffff00;
                                  req.host_id._M_string_length = 0;
                                  req.host_id.field_2._M_allocated_capacity =
                                       req.host_id.field_2._M_allocated_capacity &
                                       0xffffffffffffff00;
                                  req.owner_account._M_string_length = 0;
                                  req.owner_account.field_2._M_allocated_capacity =
                                       req.owner_account.field_2._M_allocated_capacity &
                                       0xffffffffffffff00;
                                  local_218._M_allocated_capacity = (size_type)local_208;
                                  local_218._8_8_ = (undefined1 *)0x0;
                                  local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
                                  req.load_balancer_id._M_dataplus._M_p = (pointer)paVar1;
                                  req.backend_servers._M_dataplus._M_p = (pointer)paVar2;
                                  req.host_id._M_dataplus._M_p = (pointer)paVar3;
                                  req.owner_account._M_dataplus._M_p = (pointer)paVar4;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&resp,"cn-hangzhou",
                                             (allocator<char> *)local_358);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_378,"my_appid",(allocator<char> *)&local_3b8);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_398,"my_secret",&local_3b9);
                                  proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)
                                               aliyun::Slb::CreateSlbClient
                                                         (&resp,local_378,local_398);
                                  std::__cxx11::string::~string(local_398);
                                  std::__cxx11::string::~string(local_378);
                                  std::__cxx11::string::~string((string *)&resp);
                                  if (proxy_host ==
                                      (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
                                    aliyun::SlbSetLoadBanancerListenerStatusRequestType::
                                    ~SlbSetLoadBanancerListenerStatusRequestType
                                              ((SlbSetLoadBanancerListenerStatusRequestType *)&req);
                                    return 0;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_358,"127.0.0.1:12234",
                                             (allocator<char> *)&local_3b8);
                                  aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                                  std::__cxx11::string::~string((string *)local_358);
                                  if ((char)(proxy_host->listener_port)._M_string_length == '\x01')
                                  {
                                    *(undefined1 *)
                                     ((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                                  }
                                  pHVar7 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_3b8,"{}",&local_3b9);
                                  HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                                  std::__cxx11::string::~string((string *)&local_3b8);
                                  HttpTestListener::Start(pHVar7);
                                  std::__cxx11::string::assign((char *)&req);
                                  std::__cxx11::string::assign((char *)&req.backend_servers);
                                  std::__cxx11::string::assign((char *)&req.host_id);
                                  std::__cxx11::string::assign((char *)&req.owner_account);
                                  std::__cxx11::string::assign(local_218._M_local_buf);
                                  aliyun::Slb::SetLoadBanancerListenerStatus
                                            ((SlbSetLoadBanancerListenerStatusRequestType *)
                                             proxy_host,
                                             (SlbSetLoadBanancerListenerStatusResponseType *)&req,
                                             (SlbErrorInfo *)&resp_2);
                                  HttpTestListener::WaitComplete(pHVar7);
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_358,"127.0.0.1:12234",
                                             (allocator<char> *)&local_3b8);
                                  aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                                  std::__cxx11::string::~string((string *)local_358);
                                  if ((char)(proxy_host->listener_port)._M_string_length == '\x01')
                                  {
                                    *(undefined1 *)
                                     ((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                                  }
                                  pHVar7 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_3b8,"{}",&local_3b9);
                                  HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                                  std::__cxx11::string::~string((string *)&local_3b8);
                                  HttpTestListener::Start(pHVar7);
                                  std::__cxx11::string::assign((char *)&req);
                                  std::__cxx11::string::assign((char *)&req.backend_servers);
                                  std::__cxx11::string::assign((char *)&req.host_id);
                                  std::__cxx11::string::assign((char *)&req.owner_account);
                                  std::__cxx11::string::assign(local_218._M_local_buf);
                                  std::__cxx11::string::assign(local_1f8._M_local_buf);
                                  std::__cxx11::string::assign(local_1d8._M_local_buf);
                                  std::__cxx11::string::assign(local_1b8._M_local_buf);
                                  std::__cxx11::string::assign(local_198._M_local_buf);
                                  std::__cxx11::string::assign(local_178._M_local_buf);
                                  std::__cxx11::string::assign((char *)&local_158);
                                  std::__cxx11::string::assign((char *)&local_138);
                                  aliyun::Slb::SetLoadBalancerTCPListenerAttribute
                                            ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)
                                             proxy_host,
                                             (SlbSetLoadBalancerTCPListenerAttributeResponseType *)
                                             &req,(SlbErrorInfo *)&resp_2);
                                  HttpTestListener::WaitComplete(pHVar7);
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_358,"127.0.0.1:12234",
                                           (allocator<char> *)&local_3b8);
                                aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                                std::__cxx11::string::~string((string *)local_358);
                                if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                                  *(undefined1 *)
                                   ((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                                }
                                pHVar7 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_3b8,"{}",&local_3b9);
                                HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                                std::__cxx11::string::~string((string *)&local_3b8);
                                HttpTestListener::Start(pHVar7);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&req.backend_servers);
                                std::__cxx11::string::assign((char *)&req.host_id);
                                std::__cxx11::string::assign((char *)&req.owner_account);
                                aliyun::Slb::SetLoadBalancerStatus
                                          ((SlbSetLoadBalancerStatusRequestType *)proxy_host,
                                           (SlbSetLoadBalancerStatusResponseType *)&req,
                                           (SlbErrorInfo *)&resp_2);
                                HttpTestListener::WaitComplete(pHVar7);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_358,"127.0.0.1:12234",
                                         (allocator<char> *)&local_3b8);
                              aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                              std::__cxx11::string::~string((string *)local_358);
                              if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                                *(undefined1 *)
                                 ((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                              }
                              pHVar7 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_3b8,"{}",&local_3b9);
                              HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                              std::__cxx11::string::~string((string *)&local_3b8);
                              HttpTestListener::Start(pHVar7);
                              std::__cxx11::string::assign((char *)&req);
                              std::__cxx11::string::assign((char *)&req.backend_servers);
                              std::__cxx11::string::assign((char *)&req.host_id);
                              std::__cxx11::string::assign((char *)&req.owner_account);
                              aliyun::Slb::SetLoadBalancerName
                                        ((SlbSetLoadBalancerNameRequestType *)proxy_host,
                                         (SlbSetLoadBalancerNameResponseType *)&req,
                                         (SlbErrorInfo *)&resp_2);
                              HttpTestListener::WaitComplete(pHVar7);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_358,"127.0.0.1:12234",
                                       (allocator<char> *)&local_3b8);
                            aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                            std::__cxx11::string::~string((string *)local_358);
                            if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                              *(undefined1 *)
                               ((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                            }
                            pHVar7 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_3b8,"{}",&local_3b9);
                            HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                            std::__cxx11::string::~string((string *)&local_3b8);
                            HttpTestListener::Start(pHVar7);
                            std::__cxx11::string::assign((char *)&req);
                            std::__cxx11::string::assign((char *)&req.backend_servers);
                            std::__cxx11::string::assign((char *)&req.host_id);
                            std::__cxx11::string::assign((char *)&req.owner_account);
                            std::__cxx11::string::assign(local_218._M_local_buf);
                            aliyun::Slb::SetLoadBalancerListenerStatus
                                      ((SlbSetLoadBalancerListenerStatusRequestType *)proxy_host,
                                       (SlbSetLoadBalancerListenerStatusResponseType *)&req,
                                       (SlbErrorInfo *)&resp_2);
                            HttpTestListener::WaitComplete(pHVar7);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_358,"127.0.0.1:12234",
                                     (allocator<char> *)&local_3b8);
                          aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                          std::__cxx11::string::~string((string *)local_358);
                          if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                            *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1)
                                 = 0;
                          }
                          pHVar7 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3b8,"{}",&local_3b9);
                          HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                          std::__cxx11::string::~string((string *)&local_3b8);
                          HttpTestListener::Start(pHVar7);
                          std::__cxx11::string::assign((char *)&req);
                          std::__cxx11::string::assign((char *)&req.backend_servers);
                          std::__cxx11::string::assign((char *)&req.host_id);
                          std::__cxx11::string::assign((char *)&req.owner_account);
                          std::__cxx11::string::assign(local_218._M_local_buf);
                          std::__cxx11::string::assign(local_1f8._M_local_buf);
                          std::__cxx11::string::assign(local_1d8._M_local_buf);
                          std::__cxx11::string::assign(local_1b8._M_local_buf);
                          std::__cxx11::string::assign(local_198._M_local_buf);
                          std::__cxx11::string::assign(local_178._M_local_buf);
                          std::__cxx11::string::assign((char *)&local_158);
                          std::__cxx11::string::assign((char *)&local_138);
                          std::__cxx11::string::assign((char *)&local_118);
                          std::__cxx11::string::assign((char *)&local_f8);
                          std::__cxx11::string::assign((char *)&local_d8);
                          std::__cxx11::string::assign((char *)&local_b8);
                          std::__cxx11::string::assign((char *)&local_98);
                          aliyun::Slb::SetLoadBalancerHTTPListenerAttribute
                                    ((SlbSetLoadBalancerHTTPListenerAttributeRequestType *)
                                     proxy_host,
                                     (SlbSetLoadBalancerHTTPListenerAttributeResponseType *)&req,
                                     (SlbErrorInfo *)&resp_2);
                          HttpTestListener::WaitComplete(pHVar7);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2
                                  );
                        aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
                        std::__cxx11::string::~string((string *)&local_3b8);
                        if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                          *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) =
                               0;
                        }
                        pHVar7 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp_2,
                                   "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"LoadBalancerId\": \"LoadBalancerId\"}"
                                   ,&local_3b9);
                        HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
                        std::__cxx11::string::~string((string *)&resp_2);
                        HttpTestListener::Start(pHVar7);
                        std::__cxx11::string::assign((char *)&req);
                        std::__cxx11::string::assign((char *)&req.backend_servers);
                        std::__cxx11::string::assign((char *)&req.host_id);
                        std::__cxx11::string::assign((char *)&req.owner_account);
                        aliyun::Slb::RemoveBackendServers
                                  ((SlbRemoveBackendServersRequestType *)proxy_host,
                                   (SlbRemoveBackendServersResponseType *)&req,(SlbErrorInfo *)&resp
                                  );
                        HttpTestListener::WaitComplete(pHVar7);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8
                                );
                      aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
                      std::__cxx11::string::~string((string *)local_358);
                      if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0
                        ;
                      }
                      pHVar7 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3b8,
                                 "{  \"Regions\": {    \"Region\": [      {        \"RegionId\": \"RegionId\"      }    ]  }}"
                                 ,&local_3b9);
                      HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
                      std::__cxx11::string::~string((string *)&local_3b8);
                      HttpTestListener::Start(pHVar7);
                      std::__cxx11::string::assign((char *)&req);
                      std::__cxx11::string::assign((char *)&req.backend_servers);
                      aliyun::Slb::DescribeRegions
                                ((SlbDescribeRegionsRequestType *)proxy_host,
                                 (SlbDescribeRegionsResponseType *)&req,(SlbErrorInfo *)&resp_2);
                      HttpTestListener::WaitComplete(pHVar7);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2);
                    aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
                    std::__cxx11::string::~string((string *)&local_3b8);
                    if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                    }
                    pHVar7 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&resp_2,
                               "{  \"ListenerPort\": 0,  \"BackendServerPort\": 0,  \"Status\": \"Status\",  \"Scheduler\": \"Scheduler\",  \"PersistenceTimeout\": 0,  \"HealthCheck\": \"HealthCheck\",  \"HealthyThreshold\": 0,  \"UnhealthyThreshold\": 0,  \"ConnectTimeout\": 0,  \"ConnectPort\": 0,  \"Interval\": 0}"
                               ,&local_3b9);
                    HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
                    std::__cxx11::string::~string((string *)&resp_2);
                    HttpTestListener::Start(pHVar7);
                    std::__cxx11::string::assign((char *)&resp);
                    std::__cxx11::string::assign((char *)&resp.load_balancer_id._M_string_length);
                    std::__cxx11::string::assign(local_2d8._M_local_buf);
                    std::__cxx11::string::assign(local_2b8._M_local_buf);
                    aliyun::Slb::DescribeLoadBalancerTCPListenerAttribute
                              ((SlbDescribeLoadBalancerTCPListenerAttributeRequestType *)proxy_host,
                               (SlbDescribeLoadBalancerTCPListenerAttributeResponseType *)&resp,
                               (SlbErrorInfo *)&req);
                    HttpTestListener::WaitComplete(pHVar7);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2);
                  aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
                  std::__cxx11::string::~string((string *)&local_3b8);
                  if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                  }
                  pHVar7 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp_2,
                             "{  \"ListenerPort\": 0,  \"BackendServerPort\": 0,  \"Status\": \"Status\",  \"XForwardedFor\": \"XForwardedFor\",  \"Scheduler\": \"Scheduler\",  \"StickySession\": \"StickySession\",  \"StickySessionapiType\": \"StickySessionapiType\",  \"CookieTimeout\": 0,  \"Cookie\": \"Cookie\",  \"HealthCheck\": \"HealthCheck\",  \"Domain\": \"Domain\",  \"URI\": \"URI\",  \"HealthyThreshold\": 0,  \"UnhealthyThreshold\": 0,  \"HealthCheckTimeout\": 0,  \"Interval\": 0}"
                             ,&local_3b9);
                  HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
                  std::__cxx11::string::~string((string *)&resp_2);
                  HttpTestListener::Start(pHVar7);
                  std::__cxx11::string::assign((char *)&resp);
                  std::__cxx11::string::assign((char *)&resp.load_balancer_id._M_string_length);
                  std::__cxx11::string::assign(local_2d8._M_local_buf);
                  std::__cxx11::string::assign(local_2b8._M_local_buf);
                  aliyun::Slb::DescribeLoadBalancerHTTPListenerAttribute
                            ((SlbDescribeLoadBalancerHTTPListenerAttributeRequestType *)proxy_host,
                             (SlbDescribeLoadBalancerHTTPListenerAttributeResponseType *)&resp,
                             (SlbErrorInfo *)&req);
                  HttpTestListener::WaitComplete(pHVar7);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2);
                aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
                std::__cxx11::string::~string((string *)&local_3b8);
                if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
                }
                pHVar7 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(pHVar7,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp_2,
                           "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"ListenerPorts\": {    \"ListenerPort\": [      \"ListenerPort\"    ]  },  \"LoadBalancerId\": \"LoadBalancerId\",  \"LoadBalancerName\": \"LoadBalancerName\",  \"LoadBalancerStatus\": \"LoadBalancerStatus\",  \"RegionId\": \"RegionId\",  \"Address\": \"Address\",  \"IsPublicAddress\": \"IsPublicAddress\"}"
                           ,&local_3b9);
                HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
                std::__cxx11::string::~string((string *)&resp_2);
                HttpTestListener::Start(pHVar7);
                std::__cxx11::string::assign((char *)&resp);
                std::__cxx11::string::assign((char *)&resp.load_balancer_id._M_string_length);
                std::__cxx11::string::assign(local_2d8._M_local_buf);
                aliyun::Slb::DescribeLoadBalancerAttribute
                          ((SlbDescribeLoadBalancerAttributeRequestType *)proxy_host,
                           (SlbDescribeLoadBalancerAttributeResponseType *)&resp,
                           (SlbErrorInfo *)&req);
                HttpTestListener::WaitComplete(pHVar7);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
              aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
              std::__cxx11::string::~string((string *)local_358);
              if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
              }
              pHVar7 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(pHVar7,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3b8,"{}",&local_3b9);
              HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
              HttpTestListener::Start(pHVar7);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.backend_servers);
              std::__cxx11::string::assign((char *)&req.host_id);
              std::__cxx11::string::assign((char *)&req.owner_account);
              aliyun::Slb::DeleteLoadBalancerListener
                        ((SlbDeleteLoadBalancerListenerRequestType *)proxy_host,
                         (SlbDeleteLoadBalancerListenerResponseType *)&req,(SlbErrorInfo *)&resp_2);
              HttpTestListener::WaitComplete(pHVar7);
            }
            goto LAB_0010946a;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
          proxy_host = (SlbCreateLoadBalancerHTTPListenerRequestType *)local_358;
          aliyun::Slb::SetProxyHost((Slb *)this->_M_local_buf,(string *)proxy_host);
          std::__cxx11::string::~string((string *)proxy_host);
          if ((char)*(size_type *)(this->_M_local_buf + 0x28) == '\x01') {
            this->_M_local_buf[0x29] = '\0';
          }
          pHVar7 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(pHVar7,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9);
          HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          HttpTestListener::Start(pHVar7);
          std::__cxx11::string::assign((char *)&req);
          std::__cxx11::string::assign((char *)&req.backend_servers);
          std::__cxx11::string::assign((char *)&req.host_id);
          std::__cxx11::string::assign((char *)&req.owner_account);
          std::__cxx11::string::assign(local_218._M_local_buf);
          std::__cxx11::string::assign(local_1f8._M_local_buf);
          std::__cxx11::string::assign(local_1d8._M_local_buf);
          std::__cxx11::string::assign(local_1b8._M_local_buf);
          std::__cxx11::string::assign(local_198._M_local_buf);
          std::__cxx11::string::assign(local_178._M_local_buf);
          std::__cxx11::string::assign((char *)&local_158);
          std::__cxx11::string::assign((char *)&local_138);
          aliyun::Slb::CreateLoadBalancerTCPListener
                    ((SlbCreateLoadBalancerTCPListenerRequestType *)this,
                     (SlbCreateLoadBalancerTCPListenerResponseType *)&req,(SlbErrorInfo *)&resp_2);
          HttpTestListener::WaitComplete(pHVar7);
          HttpTestListener::~HttpTestListener(pHVar7);
          operator_delete(pHVar7,0x180);
          aliyun::Slb::~Slb((Slb *)this->_M_local_buf);
          operator_delete(this,0x38);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
        aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
        std::__cxx11::string::~string((string *)local_358);
        if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
        }
        pHVar7 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(pHVar7,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9);
        HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        HttpTestListener::Start(pHVar7);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.backend_servers);
        std::__cxx11::string::assign((char *)&req.host_id);
        std::__cxx11::string::assign((char *)&req.owner_account);
        std::__cxx11::string::assign(this->_M_local_buf);
        aliyun::Slb::DeleteLoadBalancer
                  ((SlbDeleteLoadBalancerRequestType *)proxy_host,
                   (SlbDeleteLoadBalancerResponseType *)&req,(SlbErrorInfo *)&resp_2);
        HttpTestListener::WaitComplete(pHVar7);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_358,"127.0.0.1:12234",(allocator<char> *)&local_3b8);
        aliyun::Slb::SetProxyHost((Slb *)proxy_host,(string *)local_358);
        std::__cxx11::string::~string((string *)local_358);
        if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
        }
        pHVar7 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(pHVar7,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"{}",&local_3b9);
        HttpTestListener::SetResponseBody(pHVar7,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        HttpTestListener::Start(pHVar7);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.backend_servers);
        std::__cxx11::string::assign((char *)&req.host_id);
        std::__cxx11::string::assign((char *)&req.owner_account);
        std::__cxx11::string::assign(local_218._M_local_buf);
        std::__cxx11::string::assign(local_1f8._M_local_buf);
        std::__cxx11::string::assign(local_1d8._M_local_buf);
        std::__cxx11::string::assign(local_1b8._M_local_buf);
        std::__cxx11::string::assign(local_198._M_local_buf);
        std::__cxx11::string::assign(local_178._M_local_buf);
        std::__cxx11::string::assign((char *)&local_158);
        std::__cxx11::string::assign((char *)&local_138);
        std::__cxx11::string::assign((char *)&local_118);
        std::__cxx11::string::assign((char *)&local_f8);
        std::__cxx11::string::assign((char *)&local_d8);
        std::__cxx11::string::assign((char *)&local_b8);
        std::__cxx11::string::assign((char *)&local_98);
        std::__cxx11::string::assign((char *)&local_78);
        std::__cxx11::string::assign((char *)&local_58);
        aliyun::Slb::CreateLoadBalancerHTTPListener
                  (proxy_host,(SlbCreateLoadBalancerHTTPListenerResponseType *)&req,
                   (SlbErrorInfo *)&resp_2);
        HttpTestListener::WaitComplete(pHVar7);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2);
      aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
      }
      pHVar7 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(pHVar7,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp_2,
                 "{  \"Address\": \"Address\",  \"LoadBalancerId\": \"LoadBalancerId\",  \"LoadBalancerName\": \"LoadBalancerName\"}"
                 ,&local_3b9);
      HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
      std::__cxx11::string::~string((string *)&resp_2);
      HttpTestListener::Start(pHVar7);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.backend_servers);
      std::__cxx11::string::assign((char *)&req.host_id);
      std::__cxx11::string::assign((char *)&req.owner_account);
      std::__cxx11::string::assign(local_218._M_local_buf);
      std::__cxx11::string::assign(local_1f8._M_local_buf);
      std::__cxx11::string::assign(local_1d8._M_local_buf);
      std::__cxx11::string::assign(local_1b8._M_local_buf);
      std::__cxx11::string::assign(local_198._M_local_buf);
      aliyun::Slb::CreateLoadBalancer
                ((SlbCreateLoadBalancerRequestType *)proxy_host,
                 (SlbCreateLoadBalancerResponseType *)&req,(SlbErrorInfo *)&resp);
      HttpTestListener::WaitComplete(pHVar7);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"127.0.0.1:12234",(allocator<char> *)&resp_2);
    aliyun::Slb::SetProxyHost((Slb *)proxy_host,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    if ((char)(proxy_host->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resp_2,
               "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"LoadBalancerId\": \"LoadBalancerId\"}"
               ,&local_3b9);
    HttpTestListener::SetResponseBody(pHVar7,(string *)&resp_2);
    std::__cxx11::string::~string((string *)&resp_2);
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.backend_servers);
    std::__cxx11::string::assign((char *)&req.host_id);
    std::__cxx11::string::assign((char *)&req.owner_account);
    aliyun::Slb::AddBackendServers
              ((SlbAddBackendServersRequestType *)proxy_host,
               (SlbAddBackendServersResponseType *)&req,(SlbErrorInfo *)&resp);
    HttpTestListener::WaitComplete(pHVar7);
  }
LAB_0010946a:
  HttpTestListener::~HttpTestListener(pHVar7);
LAB_0010947a:
  operator_delete(pHVar7,0x180);
  aliyun::Slb::~Slb((Slb *)proxy_host);
  operator_delete(proxy_host,0x38);
  aliyun::SlbCreateLoadBalancerHTTPListenerRequestType::
  ~SlbCreateLoadBalancerHTTPListenerRequestType
            ((SlbCreateLoadBalancerHTTPListenerRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_backend_servers();
  test_create_load_balancer();
  test_create_load_balancer_ht_tp_listener();
  test_create_load_balancer_tc_plistener();
  test_delete_load_balancer();
  test_delete_load_balancer_listener();
  test_describe_backend_servers();
  test_describe_load_balancer_attribute();
  test_describe_load_balancer_ht_tp_listener_attribute();
  test_describe_load_balancers();
  test_describe_load_balancer_tc_plistener_attribute();
  test_describe_regions();
  test_remove_backend_servers();
  test_set_load_balancer_ht_tp_listener_attribute();
  test_set_load_balancer_listener_status();
  test_set_load_balancer_name();
  test_set_load_balancer_status();
  test_set_load_balancer_tc_plistener_attribute();
  test_set_load_banancer_listener_status();
}